

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool google::protobuf::safe_int_internal<int>(string *text,int *value_p)

{
  bool bVar1;
  bool negative;
  bool local_39;
  string local_38;
  
  *value_p = 0;
  bVar1 = safe_parse_sign(text,&local_39);
  if (bVar1) {
    if (local_39 == false) {
      std::__cxx11::string::string((string *)&local_38,(string *)text);
      bVar1 = safe_parse_positive_int<int>(&local_38,value_p);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      bVar1 = safe_parse_negative_int<int>(text,value_p);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool safe_int_internal(std::string text, IntType *value_p) {
  *value_p = 0;
  bool negative;
  if (!safe_parse_sign(&text, &negative)) {
    return false;
  }
  if (!negative) {
    return safe_parse_positive_int(text, value_p);
  } else {
    return safe_parse_negative_int(text, value_p);
  }
}